

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

int DnsStats::GetDnsName
              (uint8_t *packet,uint32_t length,uint32_t start,uint8_t *name,size_t name_max,
              size_t *name_length)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint length_00;
  uint uVar6;
  uint32_t flags;
  uint local_48;
  uint32_t local_34;
  
  uVar3 = 0;
  local_48 = 0;
  uVar5 = start;
  uVar6 = local_48;
  while( true ) {
    local_48 = uVar6;
    uVar4 = local_48;
    if ((length <= uVar5) || (name_max <= uVar3)) goto LAB_00162f30;
    bVar1 = packet[uVar5];
    length_00 = (uint)bVar1;
    if (bVar1 == 0) break;
    uVar4 = length;
    if ((~length_00 & 0xc0) == 0) {
      uVar6 = uVar5 + 2;
      if (length < uVar6) goto LAB_00162f30;
      uVar5 = (uint)packet[(ulong)uVar5 + 1] | (length_00 & 0x3f) << 8;
      if (start <= uVar5) goto LAB_00162f1b;
      if (local_48 != 0) {
        uVar6 = local_48;
      }
    }
    else {
      if (((0x3f < bVar1) || (uVar6 = uVar5 + length_00 + 1, length < uVar6)) ||
         (name_max < length_00 + uVar3 + 2)) {
LAB_00162f1b:
        uVar3 = 0;
LAB_00162f30:
        name[uVar3] = '\0';
        *name_length = uVar3;
        return uVar4;
      }
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else if (uVar3 + 1 < name_max) {
        name[uVar3] = '.';
        uVar3 = uVar3 + 1;
      }
      sVar2 = NormalizeNamePart(length_00,packet + (uVar5 + 1),name + uVar3,name_max - uVar3,
                                &local_34);
      uVar3 = sVar2 + uVar3;
      uVar5 = uVar6;
      uVar6 = local_48;
    }
  }
  uVar4 = uVar5 + 1;
  if (local_48 != 0) {
    uVar4 = local_48;
  }
  goto LAB_00162f30;
}

Assistant:

int DnsStats::GetDnsName(uint8_t * packet, uint32_t length, uint32_t start,
    uint8_t * name, size_t name_max, size_t * name_length)
{
    uint32_t l = 0;
    uint32_t name_start = start;
    uint32_t start_next = 0;
    size_t name_index = 0;

    while (start <length && name_index < name_max) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            start++;

            if (start_next == 0) {
                start_next = start;
            }
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                start_next = length;
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];

                if (new_start < name_start)
                {
                    if (start_next == 0) {
                        start_next = start + 2;
                    }
                    start = new_start;
                } else {
                    /* Basic restriction to avoid name decoding loops */
                    name_index = 0;
                    start_next = length;
                    break;
                }
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            name_index = 0;
            start_next = length;
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length ||
                name_index + l + 2 > name_max)
            {
                /* format error */
                name_index = 0;
                start_next = length;
                break;
            }
            else
            {
                uint32_t flags;
                if (name_index > 0 && name_index+1 < name_max) {
                    name[name_index++] = '.';
                }

                name_index += NormalizeNamePart(l, &packet[start + 1], name + name_index, name_max - name_index, &flags);

                start += l + 1; 
            }
        }
    }

    name[name_index] = 0;

    *name_length = name_index;

    return start_next;
}